

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

fio_str_info_s *
fio_str_capa_assert(fio_str_info_s *__return_storage_ptr__,fio_str_s_conflict *s,size_t needed)

{
  byte bVar1;
  char *__src;
  char *pcVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((s == (fio_str_s_conflict *)0x0) || (s->frozen != '\0')) {
    fio_str_info(__return_storage_ptr__,s);
    return __return_storage_ptr__;
  }
  bVar1 = s->small;
  if ((bVar1 == 0) && (pcVar2 = s->data, pcVar2 != (char *)0x0)) {
    if (needed < s->capa) {
      __return_storage_ptr__->capa = s->capa;
      __return_storage_ptr__->len = s->len;
      __return_storage_ptr__->data = pcVar2;
      return __return_storage_ptr__;
    }
    uVar5 = needed + 1 | 0xf;
    if (s->dealloc == fio_free) {
      pcVar2 = (char *)fio_realloc2(pcVar2,uVar5 + 1,s->len + 1);
      if (pcVar2 != (char *)0x0) goto LAB_0013c401;
      if (FIO_LOG_LEVEL < 1) goto LAB_0013c441;
      pcVar2 = 
      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4024"
      ;
    }
    else {
      pcVar2 = (char *)fio_malloc(uVar5 + 1);
      if (pcVar2 != (char *)0x0) {
        __src = s->data;
        memcpy(pcVar2,__src,s->len + 1);
        if (s->dealloc != (_func_void_void_ptr *)0x0) {
          (*s->dealloc)(__src);
        }
        s->dealloc = fio_free;
LAB_0013c401:
        s->capa = uVar5;
        s->data = pcVar2;
        pcVar2[uVar5] = '\0';
        __return_storage_ptr__->capa = s->capa;
        __return_storage_ptr__->len = s->len;
        __return_storage_ptr__->data = s->data;
        return __return_storage_ptr__;
      }
      if (FIO_LOG_LEVEL < 1) goto LAB_0013c441;
      pcVar2 = 
      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4027"
      ;
    }
  }
  else {
    if (needed < 0x2e) {
      __return_storage_ptr__->capa = 0x2d;
      __return_storage_ptr__->len = (ulong)(bVar1 >> 1);
      __return_storage_ptr__->data = (char *)s->reserved;
      return __return_storage_ptr__;
    }
    uVar5 = needed + 1 | 0xf;
    pcVar2 = (char *)fio_malloc(uVar5 + 1);
    if (pcVar2 != (char *)0x0) {
      uVar4 = (ulong)(s->small >> 1);
      if (s->small < 2) {
        *pcVar2 = '\0';
      }
      else {
        memcpy(pcVar2,s->reserved,uVar4 + 1);
      }
      s->small = '\0';
      s->frozen = '\0';
      s->reserved[0] = '\0';
      s->reserved[1] = '\0';
      s->reserved[2] = '\0';
      s->reserved[3] = '\0';
      s->reserved[4] = '\0';
      s->reserved[5] = '\0';
      s->reserved[6] = '\0';
      s->reserved[7] = '\0';
      s->reserved[8] = '\0';
      s->reserved[9] = '\0';
      s->reserved[10] = '\0';
      s->reserved[0xb] = '\0';
      s->reserved[0xc] = '\0';
      s->reserved[0xd] = '\0';
      s->capa = uVar5;
      s->len = uVar4;
      s->dealloc = fio_free;
      s->data = pcVar2;
      __return_storage_ptr__->capa = uVar5;
      __return_storage_ptr__->len = uVar4;
      __return_storage_ptr__->data = pcVar2;
      return __return_storage_ptr__;
    }
    if (FIO_LOG_LEVEL < 1) goto LAB_0013c441;
    pcVar2 = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4042"
    ;
  }
  FIO_LOG2STDERR(pcVar2);
LAB_0013c441:
  kill(0,2);
  piVar3 = __errno_location();
  exit(*piVar3);
}

Assistant:

FIO_FUNC fio_str_info_s fio_str_capa_assert(fio_str_s *s, size_t needed) {
  if (!s || s->frozen) {
    return fio_str_info(s);
  }
  char *tmp;
  if (s->small || !s->data) {
    if (needed < FIO_STR_SMALL_CAPA) {
      return (fio_str_info_s){.capa = (FIO_STR_SMALL_CAPA - 1),
                              .len = (size_t)(s->small >> 1),
                              .data = FIO_STR_SMALL_DATA(s)};
    }
    goto is_small;
  }
  if (needed < s->capa) {
    return (fio_str_info_s){.capa = s->capa, .len = s->len, .data = s->data};
  }
  needed = ROUND_UP_CAPA2WORDS(needed);
  if (s->dealloc == FIO_FREE) {
    tmp = (char *)FIO_REALLOC(s->data, needed + 1, s->len + 1);
    FIO_ASSERT_ALLOC(tmp);
  } else {
    tmp = (char *)FIO_MALLOC(needed + 1);
    FIO_ASSERT_ALLOC(tmp);
    memcpy(tmp, s->data, s->len + 1);
    if (s->dealloc)
      s->dealloc(s->data);
    s->dealloc = FIO_FREE;
  }
  s->capa = needed;
  s->data = tmp;
  s->data[needed] = 0;
  return (fio_str_info_s){.capa = s->capa, .len = s->len, .data = s->data};

is_small:
  /* small string (string data is within the container) */
  needed = ROUND_UP_CAPA2WORDS(needed);
  tmp = (char *)FIO_MALLOC(needed + 1);
  FIO_ASSERT_ALLOC(tmp);
  const size_t existing_len = (size_t)((s->small >> 1) & 0xFF);
  if (existing_len) {
    memcpy(tmp, FIO_STR_SMALL_DATA(s), existing_len + 1);
  } else {
    tmp[0] = 0;
  }
#ifdef FIO_STR_NO_REF
  *s = (fio_str_s){
      .small = 0,
      .capa = needed,
      .len = existing_len,
      .dealloc = FIO_FREE,
      .data = tmp,
  };
#else
  *s = (fio_str_s){
      .ref = s->ref,
      .small = 0,
      .capa = needed,
      .len = existing_len,
      .dealloc = FIO_FREE,
      .data = tmp,
  };
#endif
  return (fio_str_info_s){.capa = needed, .len = existing_len, .data = s->data};
}